

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O1

nng_err nni_aio_alloc(nni_aio **aio_p,nni_cb cb,void *arg)

{
  nng_err nVar1;
  nni_aio *aio;
  
  aio = (nni_aio *)nni_zalloc(0x1c8);
  if (aio == (nni_aio *)0x0) {
    nVar1 = NNG_ENOMEM;
  }
  else {
    nni_aio_init(aio,cb,arg);
    *aio_p = aio;
    nVar1 = NNG_OK;
  }
  return nVar1;
}

Assistant:

nng_err
nni_aio_alloc(nni_aio **aio_p, nni_cb cb, void *arg)
{
	nni_aio *aio;

	if ((aio = NNI_ALLOC_STRUCT(aio)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_aio_init(aio, cb, arg);
	*aio_p = aio;
	return (NNG_OK);
}